

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_binary.c
# Opt level: O2

size_t log_policy_format_binary_serialize
                 (log_policy policy,log_record record,void *buffer,size_t size)

{
  log_policy_instance(policy);
  *(undefined1 *)buffer = 0;
  return size;
}

Assistant:

static size_t log_policy_format_binary_serialize(log_policy policy, const log_record record, void *buffer, const size_t size)
{
	log_policy_format_binary_data binary_data = log_policy_instance(policy);

	(void)binary_data;
	(void)record;
	(void)size;

	/* TODO: implement properly this */
	*((char *)buffer) = '\0';

	return size;
}